

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O0

void penguinV::Maximum(Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
                      uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,
                      uint32_t width,uint32_t height)

{
  MaximumForm4 p_Var1;
  bool bVar2;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar3;
  Image *in_RCX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint32_t in_R8D;
  uint32_t in_R9D;
  Image *in_stack_00000008;
  uint32_t in_stack_00000010;
  uint32_t in_stack_00000018;
  uint32_t in_stack_00000020;
  uint32_t in_stack_00000028;
  ImageManager manager;
  MaximumForm4 funcTemp;
  const_iterator type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *types;
  uint8_t imageType;
  MaximumForm4 func;
  ImageTypeManager *registrator;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffea8;
  uint8_t requiredType;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  FunctionTableHolder *in_stack_fffffffffffffee0;
  ImageTypeManager *this_00;
  ImageTypeManager *in_stack_fffffffffffffef0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  undefined1 local_78 [16];
  char *in_stack_ffffffffffffff98;
  _func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
  *in_stack_ffffffffffffffa0;
  MaximumForm4 local_50;
  
  this = ImageTypeManager::instance();
  this_00 = this;
  PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  pFVar3 = ImageTypeManager::functionTable
                     (in_stack_fffffffffffffef0,(uint8_t)((ulong)this_00 >> 0x38));
  local_50 = pFVar3->Maximum;
  PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  if ((local_50 == (MaximumForm4)0x0) &&
     (bVar2 = ImageTypeManager::isIntertypeConversionEnabled(this), bVar2)) {
    ImageTypeManager::imageTypes(this_00);
    in_stack_ffffffffffffffa0 =
         (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
          *)local_78;
    local_80._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                            (in_stack_fffffffffffffea8);
    while( true ) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend(in_stack_fffffffffffffea8);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_fffffffffffffea8);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator*(&local_80);
      in_stack_fffffffffffffee0 =
           ImageTypeManager::functionTable
                     (in_stack_fffffffffffffef0,(uint8_t)((ulong)this_00 >> 0x38));
      p_Var1 = in_stack_fffffffffffffee0->Maximum;
      if (p_Var1 != (MaximumForm4)0x0) {
        __gnu_cxx::
        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator*(&local_80);
        local_50 = p_Var1;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&local_80);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  }
  requiredType = (uint8_t)((ulong)in_stack_fffffffffffffea8 >> 0x38);
  (anonymous_namespace)::
  verifyFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  anon_unknown.dwarf_84a6f::ImageManager::ImageManager
            ((ImageManager *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             requiredType);
  (*local_50)(in_RDI,in_ESI,in_EDX,in_RCX,in_R8D,in_R9D,in_stack_00000008,in_stack_00000010,
              in_stack_00000018,in_stack_00000020,in_stack_00000028);
  anon_unknown.dwarf_84a6f::ImageManager::~ImageManager((ImageManager *)in_stack_fffffffffffffee0);
  return;
}

Assistant:

void Maximum( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                  Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height )
    {
        initialize( in1, Maximum )
        func( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
    }